

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_image_t * j2k_decode_jpt_stream(opj_j2k_t *j2k,opj_cio_t *cio,opj_codestream_info_t *cstr_info)

{
  int iVar1;
  opj_dec_mstabent_t *poVar2;
  opj_cio_t *in_RSI;
  opj_j2k_t *in_RDI;
  int id;
  opj_dec_mstabent_t *e;
  opj_common_ptr cinfo;
  int position;
  opj_jpt_msg_header_t header;
  opj_image_t *image;
  int in_stack_ffffffffffffff8c;
  opj_cio_t *in_stack_ffffffffffffff90;
  opj_common_ptr cinfo_00;
  opj_cio_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int local_48;
  opj_jpt_msg_header_t local_44;
  opj_image_t *local_28;
  opj_cio_t *local_18;
  opj_j2k_t *local_10;
  opj_image_t *local_8;
  
  local_28 = (opj_image_t *)0x0;
  cinfo_00 = in_RDI->cinfo;
  in_RDI->cio = in_RSI;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = opj_image_create0();
  local_10->image = local_28;
  local_10->state = 1;
  jpt_init_msg_header(&local_44);
  jpt_read_msg_header((opj_common_ptr)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98,(opj_jpt_msg_header_t *)in_stack_ffffffffffffff90);
  local_48 = cio_tell(local_18);
  if (local_44.Class_Id == 6) {
    do {
      iVar1 = cio_numbytesleft(local_18);
      if (iVar1 == 0) {
        j2k_read_eoc((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        return local_28;
      }
      iVar1 = cio_tell(local_18);
      if (iVar1 - local_48 == local_44.Msg_length) {
        jpt_read_msg_header((opj_common_ptr)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98,
                            (opj_jpt_msg_header_t *)in_stack_ffffffffffffff90);
        local_48 = cio_tell(local_18);
        if (local_44.Class_Id != 4) {
          opj_image_destroy((opj_image_t *)in_stack_ffffffffffffff90);
          opj_event_msg(cinfo_00,1,"[JPT-stream] : Expecting Tile info !\n");
          return (opj_image_t *)0x0;
        }
      }
      in_stack_ffffffffffffffa4 = cio_read(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if ((int)in_stack_ffffffffffffffa4 >> 8 != 0xff) {
        opj_image_destroy((opj_image_t *)in_stack_ffffffffffffff90);
        iVar1 = cio_tell(local_18);
        opj_event_msg(cinfo_00,1,"%.8x: expected a marker instead of %x\n",(ulong)(iVar1 - 2),
                      (ulong)in_stack_ffffffffffffffa4);
        return (opj_image_t *)0x0;
      }
      poVar2 = j2k_dec_mstab_lookup(in_stack_ffffffffffffffa4);
      if ((local_10->state & poVar2->states) == 0) {
        opj_image_destroy((opj_image_t *)in_stack_ffffffffffffff90);
        iVar1 = cio_tell(local_18);
        opj_event_msg(cinfo_00,1,"%.8x: unexpected marker %x\n",(ulong)(iVar1 - 2),
                      (ulong)in_stack_ffffffffffffffa4);
        return (opj_image_t *)0x0;
      }
      if (poVar2->handler != (_func_void_opj_j2k_t_ptr *)0x0) {
        (*poVar2->handler)(local_10);
      }
    } while ((local_10->state != 0x20) && (local_10->state != 0x40));
    if (local_10->state == 0x40) {
      j2k_read_eoc((opj_j2k_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    if (local_10->state != 0x20) {
      opj_event_msg(cinfo_00,2,"Incomplete bitstream\n");
    }
    local_8 = local_28;
  }
  else {
    opj_image_destroy((opj_image_t *)in_stack_ffffffffffffff90);
    opj_event_msg(cinfo_00,1,"[JPT-stream] : Expecting Main header first [class_Id %d] !\n",
                  (ulong)local_44.Class_Id);
    local_8 = (opj_image_t *)0x0;
  }
  return local_8;
}

Assistant:

opj_image_t* j2k_decode_jpt_stream(opj_j2k_t *j2k, opj_cio_t *cio,  opj_codestream_info_t *cstr_info) {
	opj_image_t *image = NULL;
	opj_jpt_msg_header_t header;
	int position;
	opj_common_ptr cinfo = j2k->cinfo;

	OPJ_ARG_NOT_USED(cstr_info);

	j2k->cio = cio;

	/* create an empty image */
	image = opj_image_create0();
	j2k->image = image;

	j2k->state = J2K_STATE_MHSOC;
	
	/* Initialize the header */
	jpt_init_msg_header(&header);
	/* Read the first header of the message */
	jpt_read_msg_header(cinfo, cio, &header);
	
	position = cio_tell(cio);
	if (header.Class_Id != 6) {	/* 6 : Main header data-bin message */
		opj_image_destroy(image);
		opj_event_msg(cinfo, EVT_ERROR, "[JPT-stream] : Expecting Main header first [class_Id %d] !\n", header.Class_Id);
		return 0;
	}
	
	for (;;) {
		opj_dec_mstabent_t *e = NULL;
		int id;
		
		if (!cio_numbytesleft(cio)) {
			j2k_read_eoc(j2k);
			return image;
		}
		/* data-bin read -> need to read a new header */
		if ((unsigned int) (cio_tell(cio) - position) == header.Msg_length) {
			jpt_read_msg_header(cinfo, cio, &header);
			position = cio_tell(cio);
			if (header.Class_Id != 4) {	/* 4 : Tile data-bin message */
				opj_image_destroy(image);
				opj_event_msg(cinfo, EVT_ERROR, "[JPT-stream] : Expecting Tile info !\n");
				return 0;
			}
		}
		
		id = cio_read(cio, 2);
		if (id >> 8 != 0xff) {
			opj_image_destroy(image);
			opj_event_msg(cinfo, EVT_ERROR, "%.8x: expected a marker instead of %x\n", cio_tell(cio) - 2, id);
			return 0;
		}
		e = j2k_dec_mstab_lookup(id);
		if (!(j2k->state & e->states)) {
			opj_image_destroy(image);
			opj_event_msg(cinfo, EVT_ERROR, "%.8x: unexpected marker %x\n", cio_tell(cio) - 2, id);
			return 0;
		}
		if (e->handler) {
			(*e->handler)(j2k);
		}
		if (j2k->state == J2K_STATE_MT) {
			break;
		}
		if (j2k->state == J2K_STATE_NEOC) {
			break;
		}
	}
	if (j2k->state == J2K_STATE_NEOC) {
		j2k_read_eoc(j2k);
	}
	
	if (j2k->state != J2K_STATE_MT) {
		opj_event_msg(cinfo, EVT_WARNING, "Incomplete bitstream\n");
	}

	return image;
}